

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void * lyp_mmap(int fd,size_t addsize,size_t *length)

{
  int iVar1;
  LY_ERR *pLVar2;
  int *piVar3;
  char *pcVar4;
  long lVar5;
  void *__addr;
  void *local_d0;
  void *addr;
  size_t m;
  long pagesize;
  stat sb;
  size_t *length_local;
  size_t addsize_local;
  void *pvStack_10;
  int fd_local;
  
  sb.__glibc_reserved[2] = (__syscall_slong_t)length;
  if (-1 < fd) {
    pLVar2 = ly_errno_location();
    *pLVar2 = LY_SUCCESS;
    iVar1 = fstat(fd,(stat *)&pagesize);
    if (iVar1 == -1) {
      pLVar2 = ly_errno_location();
      *pLVar2 = LY_ESYS;
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      ly_log(LY_LLERR,"Failed to stat the file descriptor (%s) for the mmap().",pcVar4);
      pvStack_10 = (void *)0xffffffffffffffff;
    }
    else if (((uint)sb.st_nlink & 0xf000) == 0x8000) {
      if (sb.st_rdev == 0) {
        pvStack_10 = (void *)0x0;
      }
      else {
        lVar5 = sysconf(0x1e);
        if (((long)sb.st_rdev % lVar5 == 0) ||
           ((ulong)(lVar5 - (long)sb.st_rdev % lVar5) < addsize + 1)) {
          *(__dev_t *)sb.__glibc_reserved[2] = sb.st_rdev + lVar5;
          __addr = mmap((void *)0x0,*(size_t *)sb.__glibc_reserved[2],3,0x22,-1,0);
          local_d0 = mmap(__addr,sb.st_rdev,3,0x12,fd,0);
        }
        else {
          *(__dev_t *)sb.__glibc_reserved[2] = sb.st_rdev + addsize + 1;
          local_d0 = mmap((void *)0x0,*(size_t *)sb.__glibc_reserved[2],3,2,fd,0);
        }
        if (local_d0 == (void *)0xffffffffffffffff) {
          pLVar2 = ly_errno_location();
          *pLVar2 = LY_ESYS;
          piVar3 = __errno_location();
          pcVar4 = strerror(*piVar3);
          ly_log(LY_LLERR,"mmap() failed - %s",pcVar4);
        }
        pvStack_10 = local_d0;
      }
    }
    else {
      pLVar2 = ly_errno_location();
      *pLVar2 = LY_EINVAL;
      ly_log(LY_LLERR,"File to mmap() is not a regular file");
      pvStack_10 = (void *)0xffffffffffffffff;
    }
    return pvStack_10;
  }
  __assert_fail("fd >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/parser.c"
                ,0xf3,"void *lyp_mmap(int, size_t, size_t *)");
}

Assistant:

void *
lyp_mmap(int fd, size_t addsize, size_t *length)
{
    struct stat sb;
    long pagesize;
    size_t m;
    void *addr;

    assert(fd >= 0);
    ly_errno = LY_SUCCESS;

    if (fstat(fd, &sb) == -1) {
        LOGERR(LY_ESYS, "Failed to stat the file descriptor (%s) for the mmap().", strerror(errno));
        return MAP_FAILED;
    }
    if (!S_ISREG(sb.st_mode)) {
        LOGERR(LY_EINVAL, "File to mmap() is not a regular file");
        return MAP_FAILED;
    }
    if (!sb.st_size) {
        return NULL;
    }
    pagesize = sysconf(_SC_PAGESIZE);
    ++addsize;                       /* at least one additional byte for terminating NULL byte */

    m = sb.st_size % pagesize;
    if (m && pagesize - m >= addsize) {
        /* there will be enough space after the file content mapping to provide zeroed additional bytes */
        *length = sb.st_size + addsize;
        addr = mmap(NULL, *length, PROT_READ | PROT_WRITE, MAP_PRIVATE, fd, 0);
    } else {
        /* there will not be enough bytes after the file content mapping for the additional bytes and some of them
         * would overflow into another page that would not be zerroed and any access into it would generate SIGBUS.
         * Therefore we have to do the following hack with double mapping. First, the required number of bytes
         * (including the additinal bytes) is required as anonymous and thus they will be really provided (actually more
         * because of using whole pages) and also initialized by zeros. Then, the file is mapped to the same address
         * where the anonymous mapping starts. */
        *length = sb.st_size + pagesize;
        addr = mmap(NULL, *length, PROT_READ | PROT_WRITE, MAP_PRIVATE | MAP_ANONYMOUS, -1, 0);
        addr = mmap(addr, sb.st_size, PROT_READ | PROT_WRITE, MAP_PRIVATE | MAP_FIXED, fd, 0);
    }
    if (addr == MAP_FAILED) {
        LOGERR(LY_ESYS, "mmap() failed - %s", strerror(errno));
    }
    return addr;
}